

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

bool __thiscall
node::anon_unknown_2::MinerImpl::testBlockValidity
          (MinerImpl *this,CBlock *block,bool check_merkle_root,BlockValidationState *state)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  allocator<char> *in_RCX;
  byte in_DL;
  CBlockIndex *in_RSI;
  CBlock *in_RDI;
  long in_FS_OFFSET;
  CBlockIndex *tip;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock45;
  uint in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  string *in_stack_fffffffffffffef0;
  undefined6 in_stack_fffffffffffffef8;
  undefined1 in_stack_fffffffffffffefe;
  undefined1 in_stack_fffffffffffffeff;
  undefined8 in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff20;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff28;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 in_stack_ffffffffffffff8e;
  undefined6 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa6;
  allocator<char> in_stack_ffffffffffffffa7;
  CChainParams *in_stack_ffffffffffffffa8;
  BlockValidationState *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = in_DL & 1;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
             in_stack_ffffffffffffff10,(int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff08 >> 0x18,0));
  chainman((MinerImpl *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  ChainstateManager::ActiveChain
            ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  CChain::Tip((CChain *)
              CONCAT17(in_stack_fffffffffffffeff,
                       CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&in_RSI->phashBlock + 4);
  CBlockIndex::GetBlockHash
            ((CBlockIndex *)
             CONCAT17(in_stack_fffffffffffffeff,
                      CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
  bVar3 = ::operator!=((base_blob<256U> *)
                       CONCAT17(in_stack_fffffffffffffeff,
                                CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
                       (base_blob<256U> *)in_stack_fffffffffffffef0);
  if (bVar3) {
    __s = &stack0xffffffffffffffa7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this_00,__s,in_RCX);
    ValidationState<BlockValidationResult>::Error
              ((ValidationState<BlockValidationResult> *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)),
               in_stack_fffffffffffffef0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
    bVar2 = false;
  }
  else {
    chainman((MinerImpl *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    ChainstateManager::GetParams
              ((ChainstateManager *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    chainman((MinerImpl *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    ChainstateManager::ActiveChainstate
              ((ChainstateManager *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT16(in_stack_fffffffffffffefe,in_stack_fffffffffffffef8)));
    in_stack_fffffffffffffee8 = bVar2 & 1;
    bVar2 = TestBlockValidity(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                              (Chainstate *)
                              CONCAT17(in_stack_ffffffffffffffa7,
                                       CONCAT16(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa0)
                                      ),in_RDI,in_RSI,(bool)bVar2,(bool)in_stack_ffffffffffffff8e);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool testBlockValidity(const CBlock& block, bool check_merkle_root, BlockValidationState& state) override
    {
        LOCK(cs_main);
        CBlockIndex* tip{chainman().ActiveChain().Tip()};
        // Fail if the tip updated before the lock was taken
        if (block.hashPrevBlock != tip->GetBlockHash()) {
            state.Error("Block does not connect to current chain tip.");
            return false;
        }

        return TestBlockValidity(state, chainman().GetParams(), chainman().ActiveChainstate(), block, tip, /*fCheckPOW=*/false, check_merkle_root);
    }